

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts2cb.c
# Opt level: O0

uint32 * cont_ts2cb(uint32 n_ts)

{
  uint32 *puVar1;
  uint local_1c;
  uint32 i;
  uint32 *out;
  uint32 n_ts_local;
  
  puVar1 = (uint32 *)
           __ckd_calloc__((ulong)n_ts,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ts2cb.c"
                          ,0x3e);
  for (local_1c = 0; local_1c < n_ts; local_1c = local_1c + 1) {
    puVar1[local_1c] = local_1c;
  }
  return puVar1;
}

Assistant:

uint32 *
cont_ts2cb(uint32 n_ts)
{
    uint32 *out, i;

    out = ckd_calloc(n_ts, sizeof(uint32));
    for (i = 0; i < n_ts; i++) {
	out[i] = i;
    }

    return out;
}